

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest7_8::calculate
          (FunctionalTest7_8 *this,GLuint *combination,vec4<float> *left,vec4<float> *right,
          vec4<unsigned_int> *indices,vec4<float> *out_combined,vec4<float> *out_combined_inverted,
          vec4<float> *out_constant,vec4<float> *out_constant_inverted,vec4<float> *out_dynamic,
          vec4<float> *out_dynamic_inverted,vec4<float> *out_loop)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  GLuint local_88 [8];
  GLuint dynamic_combination [4];
  
  local_88[0] = combination[indices->m_x];
  local_88[1] = combination[indices->m_y];
  local_88[2] = combination[indices->m_z];
  local_88[3] = combination[indices->m_w];
  fVar12 = 1.0;
  fVar13 = 2.0;
  fVar14 = 3.0;
  fVar15 = 4.0;
  dynamic_combination[0] = 0xc0a00000;
  dynamic_combination[1] = 0xc0c00000;
  dynamic_combination[2] = 0xc0e00000;
  dynamic_combination[3] = 0xc1000000;
  fVar16 = left->m_x;
  fVar17 = left->m_y;
  fVar18 = left->m_z;
  fVar19 = left->m_w;
  fVar1 = right->m_x;
  fVar2 = right->m_y;
  fVar3 = right->m_z;
  fVar4 = right->m_w;
  lVar9 = 0xc;
  lVar10 = 0;
  fVar20 = fVar16;
  fVar21 = fVar17;
  fVar22 = fVar18;
  fVar23 = fVar19;
  fVar24 = fVar12;
  fVar25 = fVar13;
  fVar26 = fVar14;
  fVar27 = fVar15;
  fVar28 = fVar16;
  fVar29 = fVar17;
  fVar30 = fVar18;
  fVar31 = fVar19;
  fVar32 = fVar16;
  fVar33 = fVar17;
  fVar34 = fVar18;
  fVar35 = fVar19;
  do {
    bVar11 = *(int *)((long)combination + lVar10) == 0;
    if (bVar11) {
      fVar16 = fVar16 + fVar1;
      fVar17 = fVar17 + fVar2;
      fVar18 = fVar18 + fVar3;
      fVar19 = fVar19 + fVar4;
    }
    else {
      fVar16 = fVar16 * fVar1;
      fVar17 = fVar17 * fVar2;
      fVar18 = fVar18 * fVar3;
      fVar19 = fVar19 * fVar4;
    }
    fVar5 = (float)dynamic_combination[lVar10];
    fVar6 = (float)dynamic_combination[lVar10 + 1];
    fVar7 = (float)dynamic_combination[lVar10 + 2];
    fVar8 = (float)dynamic_combination[lVar10 + 3];
    if (bVar11) {
      fVar12 = fVar12 + fVar5;
      fVar13 = fVar13 + fVar6;
      fVar14 = fVar14 + fVar7;
      fVar15 = fVar15 + fVar8;
    }
    else {
      fVar12 = fVar12 * fVar5;
      fVar13 = fVar13 * fVar6;
      fVar14 = fVar14 * fVar7;
      fVar15 = fVar15 * fVar8;
    }
    bVar11 = *(int *)((long)combination + lVar9) == 0;
    if (bVar11) {
      fVar20 = fVar20 + fVar1;
      fVar21 = fVar21 + fVar2;
      fVar22 = fVar22 + fVar3;
      fVar23 = fVar23 + fVar4;
      if (!bVar11) goto LAB_00971360;
LAB_00971356:
      fVar24 = fVar24 + fVar5;
      fVar25 = fVar25 + fVar6;
      fVar26 = fVar26 + fVar7;
      fVar27 = fVar27 + fVar8;
    }
    else {
      fVar20 = fVar20 * fVar1;
      fVar21 = fVar21 * fVar2;
      fVar22 = fVar22 * fVar3;
      fVar23 = fVar23 * fVar4;
      if (bVar11) goto LAB_00971356;
LAB_00971360:
      fVar24 = fVar24 * fVar5;
      fVar25 = fVar25 * fVar6;
      fVar26 = fVar26 * fVar7;
      fVar27 = fVar27 * fVar8;
    }
    if (*(int *)((long)local_88 + lVar10) == 0) {
      fVar28 = fVar28 + fVar1;
      fVar29 = fVar29 + fVar2;
      fVar30 = fVar30 + fVar3;
      fVar31 = fVar31 + fVar4;
    }
    else {
      fVar28 = fVar28 * fVar1;
      fVar29 = fVar29 * fVar2;
      fVar30 = fVar30 * fVar3;
      fVar31 = fVar31 * fVar4;
    }
    if (*(int *)((long)local_88 + lVar9) == 0) {
      fVar32 = fVar32 + fVar1;
      fVar33 = fVar33 + fVar2;
      fVar34 = fVar34 + fVar3;
      fVar35 = fVar35 + fVar4;
    }
    else {
      fVar32 = fVar32 * fVar1;
      fVar33 = fVar33 * fVar2;
      fVar34 = fVar34 * fVar3;
      fVar35 = fVar35 * fVar4;
    }
    lVar9 = lVar9 + -4;
    lVar10 = lVar10 + 4;
    if (lVar10 == 0x10) {
      out_combined->m_x = fVar16;
      out_combined->m_y = fVar17;
      out_combined->m_z = fVar18;
      out_combined->m_w = fVar19;
      out_combined_inverted->m_x = fVar20;
      out_combined_inverted->m_y = fVar21;
      out_combined_inverted->m_z = fVar22;
      out_combined_inverted->m_w = fVar23;
      out_constant->m_x = fVar12;
      out_constant->m_y = fVar13;
      out_constant->m_z = fVar14;
      out_constant->m_w = fVar15;
      out_constant_inverted->m_x = fVar24;
      out_constant_inverted->m_y = fVar25;
      out_constant_inverted->m_z = fVar26;
      out_constant_inverted->m_w = fVar27;
      out_dynamic->m_x = fVar28;
      out_dynamic->m_y = fVar29;
      out_dynamic->m_z = fVar30;
      out_dynamic->m_w = fVar31;
      out_dynamic_inverted->m_x = fVar32;
      out_dynamic_inverted->m_y = fVar33;
      out_dynamic_inverted->m_z = fVar34;
      out_dynamic_inverted->m_w = fVar35;
      out_loop->m_x = fVar16;
      out_loop->m_y = fVar17;
      out_loop->m_z = fVar18;
      out_loop->m_w = fVar19;
      return;
    }
  } while( true );
}

Assistant:

void FunctionalTest7_8::calculate(
	const glw::GLuint combination[4], const Utils::vec4<glw::GLfloat>& left, const Utils::vec4<glw::GLfloat>& right,
	const Utils::vec4<glw::GLuint>& indices, Utils::vec4<glw::GLfloat>& out_combined,
	Utils::vec4<glw::GLfloat>& out_combined_inverted, Utils::vec4<glw::GLfloat>& out_constant,
	Utils::vec4<glw::GLfloat>& out_constant_inverted, Utils::vec4<glw::GLfloat>& out_dynamic,
	Utils::vec4<glw::GLfloat>& out_dynamic_inverted, Utils::vec4<glw::GLfloat>& out_loop) const
{
	/* Indices used by "dynamic" operations, range <0..4> */
	const GLuint dynamic_combination[4] = { combination[indices.m_x], combination[indices.m_y],
											combination[indices.m_z], combination[indices.m_w] };

	/* Values used by "constant" operations, come from shader code */
	const Utils::vec4<glw::GLfloat> constant_values[] = { Utils::vec4<glw::GLfloat>(1, 2, 3, 4),
														  Utils::vec4<glw::GLfloat>(-5, -6, -7, -8),
														  Utils::vec4<glw::GLfloat>(-1, -2, -3, -4),
														  Utils::vec4<glw::GLfloat>(5, 6, 7, 8),
														  Utils::vec4<glw::GLfloat>(1, 2, 3, 4) };

	/* Start values */
	Utils::vec4<glw::GLfloat> combined			= left;
	Utils::vec4<glw::GLfloat> combined_inverted = left;
	Utils::vec4<glw::GLfloat> constant			= constant_values[0];
	Utils::vec4<glw::GLfloat> constant_inverted = constant_values[0];
	Utils::vec4<glw::GLfloat> dynamic			= left;
	Utils::vec4<glw::GLfloat> dynamic_inverted  = left;

	/* Calculate expected results */
	for (GLuint i = 0; i < 4; ++i)
	{
		GLuint function					 = combination[i];
		GLuint function_inverted		 = combination[3 - i];
		GLuint dynamic_function			 = dynamic_combination[i];
		GLuint dynamic_function_inverted = dynamic_combination[3 - i];

		calculate(function, combined, right, combined);
		calculate(function_inverted, combined_inverted, right, combined_inverted);
		calculate(function, constant, constant_values[i + 1], constant);
		calculate(function_inverted, constant_inverted, constant_values[i + 1], constant_inverted);
		calculate(dynamic_function, dynamic, right, dynamic);
		calculate(dynamic_function_inverted, dynamic_inverted, right, dynamic_inverted);
	}

	/* Store results */
	out_combined		  = combined;
	out_combined_inverted = combined_inverted;
	out_constant		  = constant;
	out_constant_inverted = constant_inverted;
	out_dynamic			  = dynamic;
	out_dynamic_inverted  = dynamic_inverted;
	out_loop			  = combined;
}